

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::IsSubDirectory(string *cSubdir,string *cDir)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  string dir;
  string subdir;
  string s;
  string local_80;
  string local_60;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  if (cDir->_M_string_length == 0) {
    bVar3 = false;
  }
  else {
    pcVar1 = (cSubdir->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + cSubdir->_M_string_length);
    pcVar1 = (cDir->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + cDir->_M_string_length);
    ConvertToUnixSlashes(&local_60);
    ConvertToUnixSlashes(&local_80);
    if ((local_80._M_string_length < local_60._M_string_length) &&
       (local_60._M_dataplus._M_p[local_80._M_string_length] == '/')) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)&local_60);
      if (local_38 == local_80._M_string_length) {
        if (local_38 == 0) {
          bVar3 = true;
        }
        else {
          iVar2 = bcmp(local_40,local_80._M_dataplus._M_p,local_38);
          bVar3 = iVar2 == 0;
        }
      }
      else {
        bVar3 = false;
      }
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar3;
}

Assistant:

bool SystemTools::WriteRegistryValue(const kwsys_stl::string& key,
                                     const kwsys_stl::string& value,
                                     KeyWOW64 view)
{
  HKEY primaryKey = HKEY_CURRENT_USER;
  kwsys_stl::string second;
  kwsys_stl::string valuename;
  if (!SystemToolsParseRegistryKey(key, primaryKey, second, valuename))
    {
    return false;
    }

  HKEY hKey;
  DWORD dwDummy;
  wchar_t lpClass[] = L"";
  if(RegCreateKeyExW(primaryKey,
                    Encoding::ToWide(second).c_str(),
                    0,
                    lpClass,
                    REG_OPTION_NON_VOLATILE,
                    SystemToolsMakeRegistryMode(KEY_WRITE, view),
                    NULL,
                    &hKey,
                    &dwDummy) != ERROR_SUCCESS)
    {
    return false;
    }

  std::wstring wvalue = Encoding::ToWide(value);
  if(RegSetValueExW(hKey,
                   Encoding::ToWide(valuename).c_str(),
                   0,
                   REG_SZ,
                   (CONST BYTE *)wvalue.c_str(),
                   (DWORD)(sizeof(wchar_t) * (wvalue.size() + 1))) == ERROR_SUCCESS)
    {
    return true;
    }
  return false;
}